

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phrase.cpp
# Opt level: O2

vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_> *
jhu::thrax::minimalConsistentPairs
          (vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>
           *__return_storage_ptr__,Alignment *a,int maxSize)

{
  ushort uVar1;
  pointer pPVar2;
  pointer pSVar3;
  bool bVar4;
  optional<jhu::thrax::Span> oVar5;
  pointer pPVar6;
  pointer pSVar7;
  uint uVar8;
  short sVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  Span src;
  __normal_iterator<jhu::thrax::SpanPair_*,_std::vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>_>
  _Var13;
  __normal_iterator<jhu::thrax::SpanPair_*,_std::vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>_>
  __first;
  pointer pPVar14;
  int iVar15;
  const_iterator __last;
  SpanPair local_60;
  uint local_54;
  SpanPair local_50;
  pointer local_48;
  pointer local_40;
  SpanPair local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_54 = maxSize;
  std::vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>::reserve
            (__return_storage_ptr__,
             ((long)(a->super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(a->super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 2) * (long)maxSize);
  local_48 = (a->super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  pPVar6 = (a->super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_50 = (SpanPair)a;
  while (pPVar6 != local_48) {
    uVar1 = pPVar6->src;
    pPVar2 = *(pointer *)((long)local_50 + 8);
    iVar15 = (int)(short)uVar1 << 0x10;
    local_40 = pPVar6;
    for (pPVar14 = *(pointer *)local_50; pPVar14 != pPVar2; pPVar14 = pPVar14 + 1) {
      iVar10 = (ushort)pPVar14->src + 1;
      sVar9 = (short)iVar10;
      if ((short)uVar1 < sVar9) {
        pSVar7 = (__return_storage_ptr__->
                 super__Vector_base<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        pSVar3 = (__return_storage_ptr__->
                 super__Vector_base<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        src = (Span)(iVar10 * 0x10000 | (uint)uVar1);
        lVar11 = (long)pSVar3 - (long)pSVar7;
        iVar10 = (int)sVar9;
        for (lVar12 = lVar11 >> 5; 0 < lVar12; lVar12 = lVar12 + -1) {
          if (((int)pSVar7->src << 0x10 == iVar15) && ((int)pSVar7->src >> 0x10 == iVar10))
          goto LAB_00105b49;
          if (((int)pSVar7[1].src << 0x10 == iVar15) && ((int)pSVar7[1].src >> 0x10 == iVar10)) {
            pSVar7 = pSVar7 + 1;
            goto LAB_00105b49;
          }
          if (((int)pSVar7[2].src << 0x10 == iVar15) && ((int)pSVar7[2].src >> 0x10 == iVar10)) {
            pSVar7 = pSVar7 + 2;
            goto LAB_00105b49;
          }
          if (((int)pSVar7[3].src << 0x10 == iVar15) && ((int)pSVar7[3].src >> 0x10 == iVar10)) {
            pSVar7 = pSVar7 + 3;
            goto LAB_00105b49;
          }
          pSVar7 = pSVar7 + 4;
          lVar11 = lVar11 + -0x20;
        }
        lVar11 = lVar11 >> 3;
        if (lVar11 == 1) {
LAB_00105b30:
          if (src != pSVar7->src) {
            pSVar7 = pSVar3;
          }
LAB_00105b49:
          if (pSVar7 != pSVar3) goto LAB_00105bb6;
        }
        else {
          if (lVar11 == 2) {
LAB_00105b27:
            if (src != pSVar7->src) {
              pSVar7 = pSVar7 + 1;
              goto LAB_00105b30;
            }
            goto LAB_00105b49;
          }
          if (lVar11 == 3) {
            if (src != pSVar7->src) {
              pSVar7 = pSVar7 + 1;
              goto LAB_00105b27;
            }
            goto LAB_00105b49;
          }
        }
        iVar10 = iVar10 - (short)uVar1;
        if (iVar10 < 1) {
          iVar10 = 0;
        }
        if ((int)local_54 < iVar10) break;
        oVar5 = minimalTargetSpan((Alignment *)local_50,src);
        if (((uint6)oVar5.super__Optional_base<jhu::thrax::Span,_true,_true>._M_payload.
                    super__Optional_payload_base<jhu::thrax::Span> & 0x100000000) != 0) {
          uVar8 = ((int)oVar5.super__Optional_base<jhu::thrax::Span,_true,_true>._M_payload.
                        super__Optional_payload_base<jhu::thrax::Span>._M_payload >> 0x10) -
                  (int)(short)oVar5.super__Optional_base<jhu::thrax::Span,_true,_true>._M_payload.
                              super__Optional_payload_base<jhu::thrax::Span>._M_payload._0_2_;
          if ((int)uVar8 < 1) {
            uVar8 = 0;
          }
          if (uVar8 <= local_54) {
            local_60.tgt = (Span)((uint)oVar5.super__Optional_base<jhu::thrax::Span,_true,_true>.
                                        _M_payload.super__Optional_payload_base<jhu::thrax::Span>.
                                        _M_payload._0_2_ |
                                 (uint)oVar5.super__Optional_base<jhu::thrax::Span,_true,_true>.
                                       _M_payload.super__Optional_payload_base<jhu::thrax::Span>.
                                       _M_payload & 0xffff0000);
            local_60.src = src;
            std::vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>::
            emplace_back<jhu::thrax::SpanPair>(__return_storage_ptr__,&local_60);
          }
        }
      }
LAB_00105bb6:
    }
    pPVar6 = local_40 + 1;
  }
  _Var13._M_current =
       (__return_storage_ptr__->
       super__Vector_base<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>)._M_impl.
       super__Vector_impl_data._M_start;
  __last._M_current =
       (__return_storage_ptr__->
       super__Vector_base<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  lVar11 = (long)__last._M_current - (long)_Var13._M_current;
  local_60 = local_50;
  local_38 = local_50;
  for (lVar12 = lVar11 >> 5; 0 < lVar12; lVar12 = lVar12 + -1) {
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<jhu::thrax::minimalConsistentPairs(std::vector<jhu::thrax::Point,std::allocator<jhu::thrax::Point>>const&,int)::$_1>
            ::operator()((_Iter_pred<jhu::thrax::minimalConsistentPairs(std::vector<jhu::thrax::Point,std::allocator<jhu::thrax::Point>>const&,int)::__1>
                          *)&local_60,_Var13);
    __first._M_current = _Var13._M_current;
    if (bVar4) goto LAB_00105cb7;
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<jhu::thrax::minimalConsistentPairs(std::vector<jhu::thrax::Point,std::allocator<jhu::thrax::Point>>const&,int)::$_1>
            ::operator()((_Iter_pred<jhu::thrax::minimalConsistentPairs(std::vector<jhu::thrax::Point,std::allocator<jhu::thrax::Point>>const&,int)::__1>
                          *)&local_60,_Var13._M_current + 1);
    __first._M_current = _Var13._M_current + 1;
    if (bVar4) goto LAB_00105cb7;
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<jhu::thrax::minimalConsistentPairs(std::vector<jhu::thrax::Point,std::allocator<jhu::thrax::Point>>const&,int)::$_1>
            ::operator()((_Iter_pred<jhu::thrax::minimalConsistentPairs(std::vector<jhu::thrax::Point,std::allocator<jhu::thrax::Point>>const&,int)::__1>
                          *)&local_60,_Var13._M_current + 2);
    __first._M_current = _Var13._M_current + 2;
    if (bVar4) goto LAB_00105cb7;
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<jhu::thrax::minimalConsistentPairs(std::vector<jhu::thrax::Point,std::allocator<jhu::thrax::Point>>const&,int)::$_1>
            ::operator()((_Iter_pred<jhu::thrax::minimalConsistentPairs(std::vector<jhu::thrax::Point,std::allocator<jhu::thrax::Point>>const&,int)::__1>
                          *)&local_60,_Var13._M_current + 3);
    __first._M_current = _Var13._M_current + 3;
    if (bVar4) goto LAB_00105cb7;
    _Var13._M_current = _Var13._M_current + 4;
    lVar11 = lVar11 + -0x20;
  }
  lVar11 = lVar11 >> 3;
  if (lVar11 == 1) {
LAB_00105ca1:
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<jhu::thrax::minimalConsistentPairs(std::vector<jhu::thrax::Point,std::allocator<jhu::thrax::Point>>const&,int)::$_1>
            ::operator()((_Iter_pred<jhu::thrax::minimalConsistentPairs(std::vector<jhu::thrax::Point,std::allocator<jhu::thrax::Point>>const&,int)::__1>
                          *)&local_60,_Var13);
    __first._M_current = _Var13._M_current;
    if (!bVar4) {
      __first._M_current = __last._M_current;
    }
  }
  else if (lVar11 == 2) {
LAB_00105c8c:
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<jhu::thrax::minimalConsistentPairs(std::vector<jhu::thrax::Point,std::allocator<jhu::thrax::Point>>const&,int)::$_1>
            ::operator()((_Iter_pred<jhu::thrax::minimalConsistentPairs(std::vector<jhu::thrax::Point,std::allocator<jhu::thrax::Point>>const&,int)::__1>
                          *)&local_60,_Var13);
    __first._M_current = _Var13._M_current;
    if (!bVar4) {
      _Var13._M_current = _Var13._M_current + 1;
      goto LAB_00105ca1;
    }
  }
  else {
    __first._M_current = __last._M_current;
    if (lVar11 != 3) goto LAB_00105cfa;
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<jhu::thrax::minimalConsistentPairs(std::vector<jhu::thrax::Point,std::allocator<jhu::thrax::Point>>const&,int)::$_1>
            ::operator()((_Iter_pred<jhu::thrax::minimalConsistentPairs(std::vector<jhu::thrax::Point,std::allocator<jhu::thrax::Point>>const&,int)::__1>
                          *)&local_60,_Var13);
    __first._M_current = _Var13._M_current;
    if (!bVar4) {
      _Var13._M_current = _Var13._M_current + 1;
      goto LAB_00105c8c;
    }
  }
LAB_00105cb7:
  if (__first._M_current != __last._M_current) {
    _Var13._M_current = __first._M_current;
    while (_Var13._M_current = _Var13._M_current + 1, _Var13._M_current != __last._M_current) {
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<jhu::thrax::minimalConsistentPairs(std::vector<jhu::thrax::Point,std::allocator<jhu::thrax::Point>>const&,int)::$_1>
              ::operator()((_Iter_pred<jhu::thrax::minimalConsistentPairs(std::vector<jhu::thrax::Point,std::allocator<jhu::thrax::Point>>const&,int)::__1>
                            *)&local_38,_Var13);
      if (!bVar4) {
        *__first._M_current = *_Var13._M_current;
        __first._M_current = __first._M_current + 1;
      }
    }
    __last._M_current =
         (__return_storage_ptr__->
         super__Vector_base<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
LAB_00105cfa:
  std::vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>::erase
            (__return_storage_ptr__,(const_iterator)__first._M_current,__last);
  return __return_storage_ptr__;
}

Assistant:

std::vector<SpanPair> minimalConsistentPairs(const Alignment& a, int maxSize) {
  std::vector<SpanPair> result;
  result.reserve(maxSize * a.size());  // over-estimate
  for (auto startPoint : a) {
    for (auto endPoint : a) {
      Span src{ startPoint.src, static_cast<IndexType>(endPoint.src + 1) };
      if (src.empty()) {
        continue;
      } else if (auto it = std::find_if(
          result.begin(), result.end(), [src](auto p) { return src == p.src; });
          it != result.end()) {
        continue;
      } else if (src.size() > maxSize) {
        break;
      }
      if (auto tgt = minimalTargetSpan(a, src);
          tgt.has_value() && tgt->size() <= maxSize) {
        result.push_back(SpanPair{ src, *tgt });
      }
    }
  }
  auto it = std::remove_if(
      result.begin(),
      result.end(),
      [&a](auto sp) { return !isConsistent(a, sp); });
  result.erase(it, result.end());
  return result;
}